

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O3

type dukglue_pcall_method<void,DukValue,int>
               (duk_context *ctx,DukValue *obj,char *method_name,int args)

{
  duk_int_t return_code;
  DukErrorException *this;
  SafeMethodCallData<void,_DukValue,_int> data;
  DukValue *local_38;
  char *local_30;
  int local_28;
  undefined8 local_20;
  
  local_20 = 0;
  local_38 = obj;
  local_30 = method_name;
  local_28 = args;
  return_code = duk_safe_call(ctx,dukglue::detail::call_method_safe<void,DukValue,int>,&local_38,0,1
                             );
  if (return_code == 0) {
    duk_pop(ctx);
    return;
  }
  this = (DukErrorException *)__cxa_allocate_exception(0x28);
  DukErrorException::DukErrorException(this,ctx,return_code,true);
  __cxa_throw(this,&DukErrorException::typeinfo,DukException::~DukException);
}

Assistant:

typename std::enable_if<std::is_void<RetT>::value, RetT>::type dukglue_pcall_method(duk_context* ctx, const ObjT& obj, const char* method_name, ArgTs... args)
{
	dukglue::detail::SafeMethodCallData<RetT, ObjT, ArgTs...> data {
		&obj, method_name, std::tuple<ArgTs...>(args...), nullptr
	};

	duk_idx_t rc = duk_safe_call(ctx, &dukglue::detail::call_method_safe<RetT, ObjT, ArgTs...>, (void*) &data, 0, 1);
	if (rc != 0)
		throw DukErrorException(ctx, rc);

	duk_pop(ctx);  // remove result from stack
}